

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pltcalc.cpp
# Opt level: O0

void pltcalc::loadoccurrence(void)

{
  period_occ local_4c;
  period_occ p_1;
  occurrence occ_1;
  period_occ_granular p;
  occurrence_granular occ;
  int date_opts;
  FILE *fin;
  
  register0x00000000 = fopen("input/occurrence.bin","rb");
  if (register0x00000000 == (FILE *)0x0) {
    fprintf(_stderr,"FATAL: %s: Error opening file %s\n","loadoccurrence","input/occurrence.bin");
    exit(-1);
  }
  fread(&occ.occ_date_id,4,1,register0x00000000);
  date_algorithm_ = (uint)occ.occ_date_id & 1;
  granular_date_ = (int)(uint)occ.occ_date_id >> 1;
  if (granular_date_ == 0) {
    loadoccurrence<occurrence,period_occ,std::map<int,std::vector<period_occ,std::allocator<period_occ>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ,std::allocator<period_occ>>>>>>
              ((occurrence *)&p_1,&local_4c,
               (map<int,_std::vector<period_occ,_std::allocator<period_occ>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ,_std::allocator<period_occ>_>_>_>_>
                *)m_occ_legacy,(FILE *)stack0xfffffffffffffff0);
  }
  else {
    loadoccurrence<occurrence_granular,period_occ_granular,std::map<int,std::vector<period_occ_granular,std::allocator<period_occ_granular>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ_granular,std::allocator<period_occ_granular>>>>>>
              ((occurrence_granular *)((long)&p.occ_date_id + 4),
               (period_occ_granular *)&occ_1.period_no,
               (map<int,_std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>_>_>_>
                *)m_occ_granular,(FILE *)stack0xfffffffffffffff0);
  }
  fclose(stack0xfffffffffffffff0);
  return;
}

Assistant:

void loadoccurrence()
	{
		FILE* fin = fopen(OCCURRENCE_FILE, "rb");
		if (fin == NULL) {
			fprintf(stderr, "FATAL: %s: Error opening file %s\n",
				__func__, OCCURRENCE_FILE);
			exit(-1);
		}

		int date_opts;
		fread(&date_opts, sizeof(date_opts), 1, fin);
		date_algorithm_ = date_opts & 1;
		granular_date_ = date_opts >> 1;

		if (granular_date_) {
			occurrence_granular occ;
			period_occ_granular p;
			loadoccurrence(occ, p, m_occ_granular, fin);
		} else {
			occurrence occ;
			period_occ p;
			loadoccurrence(occ, p, m_occ_legacy, fin);
		}

		fclose(fin);
	}